

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListViewPrivate::selectAll(QListViewPrivate *this,SelectionFlags command)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QItemSelectionModel *pQVar5;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int rowCount;
  int colCount;
  int row;
  QModelIndex bottomRight_1;
  QModelIndex bottomRight;
  QModelIndex topLeft;
  QItemSelection selection;
  rvalue_ref in_stack_fffffffffffffe58;
  QModelIndex *in_stack_fffffffffffffe60;
  QModelIndex *bottomR;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  QItemSelectionRange *in_stack_fffffffffffffe70;
  long *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int local_14c;
  QPersistentModelIndex local_128 [3];
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  QPersistentModelIndex local_f8 [3];
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  QPersistentModelIndex local_a0 [3];
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  QPersistentModelIndex local_70 [3];
  QPersistentModelIndex local_58 [3];
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x8779ae);
  if (bVar2) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QItemSelection::QItemSelection((QItemSelection *)0x8779f1);
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x877a2b);
    local_14c = 0;
    plVar1 = *(long **)(in_RDI + 0x2f8);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_58);
    iVar3 = (**(code **)(*plVar1 + 0x80))(plVar1,local_58);
    plVar1 = *(long **)(in_RDI + 0x2f8);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_70);
    iVar4 = (**(code **)(*plVar1 + 0x78))(plVar1,local_70);
    for (; local_14c < iVar4; local_14c = local_14c + 1) {
      bVar2 = isHidden((QListViewPrivate *)
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       (int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      if (bVar2) {
        bVar2 = QModelIndex::isValid(in_stack_fffffffffffffe60);
        if (bVar2) {
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          local_80 = &DAT_aaaaaaaaaaaaaaaa;
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          in_stack_fffffffffffffe80 = *(long **)(in_RDI + 0x2f8);
          in_stack_fffffffffffffe88 = local_14c + -1;
          in_stack_fffffffffffffe8c = iVar3 + -1;
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_a0);
          (**(code **)(*in_stack_fffffffffffffe80 + 0x60))
                    (&local_88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
                     in_stack_fffffffffffffe8c,local_a0);
          QItemSelectionRange::QItemSelectionRange
                    (in_stack_fffffffffffffe70,
                     (QModelIndex *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     in_stack_fffffffffffffe60);
          QList<QItemSelectionRange>::append
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe58);
          QItemSelectionRange::~QItemSelectionRange
                    ((QItemSelectionRange *)in_stack_fffffffffffffe60);
          QModelIndex::QModelIndex((QModelIndex *)0x877bc0);
          local_40 = local_c8;
          local_38 = local_c0;
          local_30 = local_b8;
        }
      }
      else {
        bVar2 = QModelIndex::isValid(in_stack_fffffffffffffe60);
        if (!bVar2) {
          in_stack_fffffffffffffe70 = *(QItemSelectionRange **)(in_RDI + 0x2f8);
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_f8);
          (**(code **)((in_stack_fffffffffffffe70->tl).d + 0x60))
                    (&local_e0,in_stack_fffffffffffffe70,local_14c,0,local_f8);
          local_40 = local_e0;
          local_38 = local_d8;
          local_30 = local_d0;
        }
      }
    }
    bVar2 = QModelIndex::isValid(in_stack_fffffffffffffe60);
    if (bVar2) {
      local_110 = &DAT_aaaaaaaaaaaaaaaa;
      local_108 = &DAT_aaaaaaaaaaaaaaaa;
      local_100 = &DAT_aaaaaaaaaaaaaaaa;
      bottomR = *(QModelIndex **)(in_RDI + 0x2f8);
      local_14c = local_14c + -1;
      iVar3 = iVar3 + -1;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_128);
      (**(code **)(*(long *)bottomR + 0x60))(&local_110,bottomR,local_14c,iVar3,local_128);
      QItemSelectionRange::QItemSelectionRange
                (in_stack_fffffffffffffe70,(QModelIndex *)CONCAT44(iVar3,local_14c),bottomR);
      QList<QItemSelectionRange>::append
                ((QList<QItemSelectionRange> *)bottomR,in_stack_fffffffffffffe58);
      QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)bottomR);
    }
    bVar2 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x877d7a);
    if (!bVar2) {
      pQVar5 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x877d8f);
      (**(code **)(*(long *)pQVar5 + 0x70))(pQVar5,&local_28,local_c);
    }
    QItemSelection::~QItemSelection((QItemSelection *)0x877dbc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListViewPrivate::selectAll(QItemSelectionModel::SelectionFlags command)
{
    if (!selectionModel)
        return;

    QItemSelection selection;
    QModelIndex topLeft;
    int row = 0;
    const int colCount = model->columnCount(root);
    const int rowCount = model->rowCount(root);
    for ( ; row < rowCount; ++row) {
        if (isHidden(row)) {
            //it might be the end of a selection range
            if (topLeft.isValid()) {
                QModelIndex bottomRight = model->index(row - 1, colCount - 1, root);
                selection.append(QItemSelectionRange(topLeft, bottomRight));
                topLeft = QModelIndex();
            }
            continue;
        }

        if (!topLeft.isValid()) //start of a new selection range
            topLeft = model->index(row, 0, root);
    }

    if (topLeft.isValid()) {
        //last selected range
        QModelIndex bottomRight = model->index(row - 1, colCount - 1, root);
        selection.append(QItemSelectionRange(topLeft, bottomRight));
    }

    if (!selection.isEmpty())
        selectionModel->select(selection, command);
}